

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O2

void writePrimalSolution<double>
               (SoPlexBase<double> *soplex,char *filename,NameSet *colnames,NameSet *rownames,
               bool real,bool rational,bool append)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  long lVar2;
  Real RVar3;
  double dVar4;
  pointer pnVar5;
  bool bVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  int i_1;
  undefined3 in_register_00000081;
  int iVar10;
  int i;
  long lVar11;
  long lVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  VectorRational primal_1;
  double local_2b8;
  longlong local_298;
  undefined4 local_28c;
  undefined1 local_288 [16];
  VectorBase<double> primal;
  ofstream outfile;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228 [63];
  
  local_28c = CONCAT31(in_register_00000081,real);
  psVar1 = &soplex->_tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&outfile,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar3 = ::soplex::Tolerances::epsilon(_outfile);
  dVar4 = log10(RVar3);
  local_288._8_4_ = extraout_XMM0_Dc;
  local_288._0_8_ = dVar4;
  local_288._12_4_ = extraout_XMM0_Dd;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_228);
  std::ofstream::ofstream(&outfile);
  std::ofstream::open((char *)&outfile,(_Ios_Openmode)filename);
  lVar9 = (long)((int)-(double)local_288._0_8_ + 10);
  lVar7 = (long)(int)-(double)local_288._0_8_;
  local_2b8._0_1_ = (char)rownames;
  if (local_2b8._0_1_ == '\0') goto LAB_0012c03a;
  ::soplex::VectorBase<double>::VectorBase
            (&primal,(soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                     thenum);
  bVar6 = ::soplex::SoPlexBase<double>::getPrimalRay(soplex,&primal);
  if (bVar6) {
    std::operator<<((ostream *)&outfile,"\nPrimal ray (name, value):\n");
    for (lVar11 = 0;
        lVar11 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        lVar11 = lVar11 + 1) {
      local_2b8 = primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&primal_1,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar3 = ::soplex::Tolerances::epsilon
                        ((Tolerances *)
                         primal_1.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      local_288._0_8_ = RVar3;
      local_2b8 = ABS(local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &primal_1.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if ((double)local_288._0_8_ < local_2b8) {
        poVar8 = std::operator<<((ostream *)&outfile,
                                 colnames->mem +
                                 (colnames->set).theitem[(colnames->set).thekey[lVar11].idx].data);
        poVar8 = std::operator<<(poVar8,"\t");
        lVar12 = *(long *)poVar8;
        *(long *)(poVar8 + *(long *)(lVar12 + -0x18) + 0x10) = lVar9;
        *(long *)(poVar8 + *(long *)(lVar12 + -0x18) + 8) = lVar7;
        poVar8 = std::ostream::_M_insert<double>
                           (primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar11]);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
    poVar8 = std::operator<<((ostream *)&outfile,"All other entries are zero (within ");
    lVar11 = *(long *)poVar8;
    *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 1;
    lVar11 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar8 + lVar11 + 0x18) = *(uint *)(poVar8 + lVar11 + 0x18) & 0xfffffefb | 0x100;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&primal_1,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar3 = ::soplex::Tolerances::epsilon
                      ((Tolerances *)
                       primal_1.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    poVar8 = std::ostream::_M_insert<double>(RVar3);
    lVar11 = *(long *)poVar8;
    *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 8;
    lVar11 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar8 + lVar11 + 0x18) = *(uint *)(poVar8 + lVar11 + 0x18) & 0xfffffefb | 4;
    poVar8 = std::operator<<(poVar8,").");
    std::endl<char,std::char_traits<char>>(poVar8);
LAB_0012c010:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &primal_1.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    bVar6 = ::soplex::SoPlexBase<double>::isPrimalFeasible(soplex);
    if ((bVar6) && (bVar6 = ::soplex::SoPlexBase<double>::getPrimal(soplex,&primal), bVar6)) {
      std::operator<<((ostream *)&outfile,"\nPrimal solution (name, value):\n");
      iVar10 = 0;
      for (lVar11 = 0;
          lVar11 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
          lVar11 = lVar11 + 1) {
        local_2b8 = primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&primal_1,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar3 = ::soplex::Tolerances::epsilon
                          ((Tolerances *)
                           primal_1.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        local_288._0_8_ = RVar3;
        local_2b8 = ABS(local_2b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &primal_1.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        if ((double)local_288._0_8_ < local_2b8) {
          poVar8 = std::operator<<((ostream *)&outfile,
                                   colnames->mem +
                                   (colnames->set).theitem[(colnames->set).thekey[lVar11].idx].data)
          ;
          poVar8 = std::operator<<(poVar8,"\t");
          lVar12 = *(long *)poVar8;
          *(long *)(poVar8 + *(long *)(lVar12 + -0x18) + 0x10) = lVar9;
          *(long *)(poVar8 + *(long *)(lVar12 + -0x18) + 8) = lVar7;
          poVar8 = std::ostream::_M_insert<double>
                             (primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar11]);
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar10 = iVar10 + 1;
        }
      }
      poVar8 = std::operator<<((ostream *)&outfile,"All other variables are zero (within ");
      lVar11 = *(long *)poVar8;
      *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 1;
      lVar11 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar8 + lVar11 + 0x18) = *(uint *)(poVar8 + lVar11 + 0x18) & 0xfffffefb | 0x100;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&primal_1,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar3 = ::soplex::Tolerances::epsilon
                        ((Tolerances *)
                         primal_1.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      poVar8 = std::ostream::_M_insert<double>(RVar3);
      lVar11 = *(long *)poVar8;
      *(undefined8 *)(poVar8 + *(long *)(lVar11 + -0x18) + 8) = 8;
      lVar11 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar8 + lVar11 + 0x18) = *(uint *)(poVar8 + lVar11 + 0x18) & 0xfffffefb | 4;
      poVar8 = std::operator<<(poVar8,"). Solution has ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar10);
      poVar8 = std::operator<<(poVar8," nonzero entries.");
      std::endl<char,std::char_traits<char>>(poVar8);
      goto LAB_0012c010;
    }
    std::operator<<((ostream *)&outfile,"No primal information available.\n");
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&primal);
LAB_0012c03a:
  if ((char)local_28c != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase(&primal_1,
                 (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    bVar6 = ::soplex::SoPlexBase<double>::getPrimalRayRational(soplex,&primal_1);
    if (bVar6) {
      std::operator<<((ostream *)&outfile,"\nPrimal ray (name, value):\n");
      lVar11 = 0;
      for (lVar12 = 0;
          pnVar5 = primal_1.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar12 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
          lVar12 = lVar12 + 1) {
        local_298 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&primal,&local_298,(type *)0x0);
        bVar6 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)((long)&(pnVar5->m_backend).m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar11),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)&primal);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&primal);
        if (bVar6) {
          poVar8 = std::operator<<((ostream *)&outfile,
                                   colnames->mem +
                                   (colnames->set).theitem[(colnames->set).thekey[lVar12].idx].data)
          ;
          poVar8 = std::operator<<(poVar8,"\t");
          lVar2 = *(long *)poVar8;
          *(long *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = lVar9;
          *(long *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = lVar7;
          poVar8 = boost::multiprecision::operator<<
                             (poVar8,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)((long)&((primal_1.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                m_backend).m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar11));
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        lVar11 = lVar11 + 0x40;
      }
      poVar8 = std::operator<<((ostream *)&outfile,"All other entries are zero.");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    bVar6 = ::soplex::SoPlexBase<double>::isPrimalFeasible(soplex);
    if ((bVar6) &&
       (bVar6 = ::soplex::SoPlexBase<double>::getPrimalRational(soplex,&primal_1), bVar6)) {
      std::operator<<((ostream *)&outfile,"\nPrimal solution (name, value):\n");
      lVar9 = 0;
      iVar10 = 0;
      for (lVar7 = 0;
          pnVar5 = primal_1.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar7 < (soplex->_rationalLP->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .set.thenum; lVar7 = lVar7 + 1) {
        local_298 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&primal,&local_298,(type *)0x0);
        bVar6 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)((long)&(pnVar5->m_backend).m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar9),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)&primal);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&primal);
        if (bVar6) {
          poVar8 = std::operator<<((ostream *)&outfile,
                                   colnames->mem +
                                   (colnames->set).theitem[(colnames->set).thekey[lVar7].idx].data);
          poVar8 = std::operator<<(poVar8,"\t");
          poVar8 = boost::multiprecision::operator<<
                             (poVar8,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)((long)&((primal_1.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                m_backend).m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar9));
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar10 = iVar10 + 1;
        }
        lVar9 = lVar9 + 0x40;
      }
      poVar8 = std::operator<<((ostream *)&outfile,"All other variables are zero. Solution has ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar10);
      poVar8 = std::operator<<(poVar8," nonzero entries.");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    else {
      std::operator<<((ostream *)&outfile,"No primal (rational) solution available.\n");
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector(&primal_1.val);
  }
  std::ofstream::~ofstream(&outfile);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}